

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cpp
# Opt level: O0

char * anon_unknown.dwarf_2b41b::handle_collision
                 (file_entry *oldfile,data_entry *olddata,file_entry *newfile,data_entry *newdata)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  TypesafeBoolean p_Var4;
  _Base_bitset<1UL> this;
  long in_RCX;
  long in_RSI;
  long in_RDI;
  bool version_info_valid;
  bool allow_timestamp;
  byte local_97;
  byte local_96;
  byte local_95;
  bool local_93;
  bool local_92;
  byte local_91;
  checksum *in_stack_ffffffffffffff70;
  enum_type eVar5;
  checksum *in_stack_ffffffffffffff78;
  char *local_8;
  
  bVar3 = true;
  flags<setup::file_entry::flags_Enum_,_33UL>::operator&
            ((flags<setup::file_entry::flags_Enum_,_33UL> *)in_stack_ffffffffffffff78,
             (enum_type)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  bVar1 = flags<setup::data_entry::flags_Enum_,_12UL>::operator!
                    ((flags<setup::data_entry::flags_Enum_,_12UL> *)0x12601b);
  if (bVar1) {
    flags<setup::data_entry::flags_Enum_,_12UL>::operator&
              ((flags<setup::data_entry::flags_Enum_,_12UL> *)in_stack_ffffffffffffff78,
               (enum_type)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    bVar3 = flags<setup::data_entry::flags_Enum_,_12UL>::operator!
                      ((flags<setup::data_entry::flags_Enum_,_12UL> *)0x126043);
    bVar2 = (bVar3 ^ 0xffU) & 1;
    flags<setup::data_entry::flags_Enum_,_12UL>::operator&
              ((flags<setup::data_entry::flags_Enum_,_12UL> *)in_stack_ffffffffffffff78,
               (enum_type)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    p_Var4 = ::flags::operator_cast_to_function_pointer
                       ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x12606d);
    if (p_Var4 == (TypesafeBoolean)0x0) {
      bVar3 = bVar2 == 0;
    }
    else {
      bVar3 = false;
      eVar5 = (enum_type)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      if ((bVar2 == 0) || (*(ulong *)(in_RCX + 0x70) < *(ulong *)(in_RSI + 0x70))) {
        flags<setup::file_entry::flags_Enum_,_33UL>::operator&
                  ((flags<setup::file_entry::flags_Enum_,_33UL> *)in_stack_ffffffffffffff78,eVar5);
        bVar1 = flags<setup::data_entry::flags_Enum_,_12UL>::operator!
                          ((flags<setup::data_entry::flags_Enum_,_12UL> *)0x1260bf);
        local_91 = 1;
        if (!bVar1) {
          bVar1 = prompt_overwrite();
          local_91 = bVar1 ^ 0xff;
        }
        if ((local_91 & 1) != 0) {
          local_8 = "old version";
          return local_8;
        }
      }
      else {
        local_92 = false;
        if (*(long *)(in_RCX + 0x70) == *(long *)(in_RSI + 0x70)) {
          flags<setup::file_entry::flags_Enum_,_33UL>::operator&
                    ((flags<setup::file_entry::flags_Enum_,_33UL> *)in_stack_ffffffffffffff78,eVar5)
          ;
          local_92 = flags<setup::data_entry::flags_Enum_,_12UL>::operator!
                               ((flags<setup::data_entry::flags_Enum_,_12UL> *)0x12613c);
        }
        if (local_92 != false) {
          flags<setup::file_entry::flags_Enum_,_33UL>::operator&
                    ((flags<setup::file_entry::flags_Enum_,_33UL> *)in_stack_ffffffffffffff78,
                     (enum_type)((ulong)in_stack_ffffffffffffff70 >> 0x20));
          p_Var4 = ::flags::operator_cast_to_function_pointer
                             ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x126172);
          local_93 = false;
          if (p_Var4 != (TypesafeBoolean)0x0) {
            local_93 = crypto::checksum::operator==
                                 (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
          }
          if (local_93 != false) {
            local_8 = "duplicate (checksum)";
            return local_8;
          }
          flags<setup::file_entry::flags_Enum_,_33UL>::operator&
                    ((flags<setup::file_entry::flags_Enum_,_33UL> *)in_stack_ffffffffffffff78,
                     (enum_type)((ulong)in_stack_ffffffffffffff70 >> 0x20));
          bVar3 = flags<setup::data_entry::flags_Enum_,_12UL>::operator!
                            ((flags<setup::data_entry::flags_Enum_,_12UL> *)0x1261ea);
          if (bVar3) {
            local_8 = "duplicate (version)";
            return local_8;
          }
          bVar3 = true;
        }
      }
    }
  }
  eVar5 = (enum_type)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  bVar1 = false;
  if (bVar3) {
    flags<setup::file_entry::flags_Enum_,_33UL>::operator&
              ((flags<setup::file_entry::flags_Enum_,_33UL> *)in_stack_ffffffffffffff78,eVar5);
    p_Var4 = ::flags::operator_cast_to_function_pointer
                       ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x12624f);
    bVar1 = p_Var4 != (TypesafeBoolean)0x0;
  }
  if (bVar1) {
    if ((*(long *)(in_RCX + 0x60) == *(long *)(in_RSI + 0x60)) &&
       (*(int *)(in_RCX + 0x68) == *(int *)(in_RSI + 0x68))) {
      local_8 = "duplicate (modification time)";
      return local_8;
    }
    if ((*(long *)(in_RCX + 0x60) < *(long *)(in_RSI + 0x60)) ||
       ((*(long *)(in_RCX + 0x60) == *(long *)(in_RSI + 0x60) &&
        (*(uint *)(in_RCX + 0x68) < *(uint *)(in_RSI + 0x68))))) {
      flags<setup::file_entry::flags_Enum_,_33UL>::operator&
                ((flags<setup::file_entry::flags_Enum_,_33UL> *)in_stack_ffffffffffffff78,eVar5);
      bVar3 = flags<setup::data_entry::flags_Enum_,_12UL>::operator!
                        ((flags<setup::data_entry::flags_Enum_,_12UL> *)0x12630f);
      local_95 = 1;
      if (!bVar3) {
        bVar3 = prompt_overwrite();
        local_95 = bVar3 ^ 0xff;
      }
      if ((local_95 & 1) != 0) {
        local_8 = "old version (modification time)";
        return local_8;
      }
    }
  }
  this._M_w = (_WordT)flags<setup::file_entry::flags_Enum_,_33UL>::operator&
                                ((flags<setup::file_entry::flags_Enum_,_33UL> *)
                                 in_stack_ffffffffffffff78,eVar5);
  p_Var4 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x12636b);
  local_96 = 0;
  if (p_Var4 != (TypesafeBoolean)0x0) {
    bVar3 = prompt_overwrite();
    local_96 = bVar3 ^ 0xff;
  }
  if ((local_96 & 1) == 0) {
    if ((*(int *)(in_RDI + 0x184) != -1) && ((*(uint *)(in_RDI + 0x184) & 1) != 0)) {
      flags<setup::file_entry::flags_Enum_,_33UL>::operator&
                ((flags<setup::file_entry::flags_Enum_,_33UL> *)this._M_w,eVar5);
      bVar3 = flags<setup::data_entry::flags_Enum_,_12UL>::operator!
                        ((flags<setup::data_entry::flags_Enum_,_12UL> *)0x1263ef);
      local_97 = 0;
      if (bVar3) {
        bVar3 = prompt_overwrite();
        local_97 = bVar3 ^ 0xff;
      }
      if ((local_97 & 1) != 0) {
        local_8 = "user chose not to overwrite read-only file";
        return local_8;
      }
    }
    local_8 = (char *)0x0;
  }
  else {
    local_8 = "user chose not to overwrite";
  }
  return local_8;
}

Assistant:

const char * handle_collision(const setup::file_entry & oldfile, const setup::data_entry & olddata,
                              const setup::file_entry & newfile, const setup::data_entry & newdata) {
	
	bool allow_timestamp = true;
	
	if(!(newfile.options & setup::file_entry::IgnoreVersion)) {
		
		bool version_info_valid = !!(newdata.options & setup::data_entry::VersionInfoValid);
		
		if(olddata.options & setup::data_entry::VersionInfoValid) {
			allow_timestamp = false;
			
			if(!version_info_valid || olddata.file_version > newdata.file_version) {
				if(!(newfile.options & setup::file_entry::PromptIfOlder) || !prompt_overwrite()) {
					return "old version";
				}
			} else if(newdata.file_version == olddata.file_version
				   && !(newfile.options & setup::file_entry::OverwriteSameVersion)) {
				
				if((newfile.options & setup::file_entry::ReplaceSameVersionIfContentsDiffer)
				   && olddata.file.checksum == newdata.file.checksum) {
					return "duplicate (checksum)";
				}
				
				if(!(newfile.options & setup::file_entry::CompareTimeStamp)) {
					return "duplicate (version)";
				}
				
				allow_timestamp = true;
			}
			
		} else if(version_info_valid) {
			allow_timestamp = false;
		}
		
	}
	
	if(allow_timestamp && (newfile.options & setup::file_entry::CompareTimeStamp)) {
		
		if(newdata.timestamp == olddata.timestamp
		   && newdata.timestamp_nsec == olddata.timestamp_nsec) {
			return "duplicate (modification time)";
		}
		
		
		if(newdata.timestamp < olddata.timestamp
		   || (newdata.timestamp == olddata.timestamp
		       && newdata.timestamp_nsec < olddata.timestamp_nsec)) {
			if(!(newfile.options & setup::file_entry::PromptIfOlder) || !prompt_overwrite()) {
				return "old version (modification time)";
			}
		}
		
	}
	
	if((newfile.options & setup::file_entry::ConfirmOverwrite) && !prompt_overwrite()) {
		return "user chose not to overwrite";
	}
	
	if(oldfile.attributes != boost::uint32_t(-1)
	   && (oldfile.attributes & setup::file_entry::ReadOnly) != 0) {
		if(!(newfile.options & setup::file_entry::OverwriteReadOnly) && !prompt_overwrite()) {
			return "user chose not to overwrite read-only file";
		}
	}
	
	return NULL; // overwrite old file
}